

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O1

int ffinit(fitsfile **fptr,char *name,int *status)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  fitsfile *pfVar6;
  FITSfile *pFVar7;
  LONGLONG *pLVar8;
  long lVar9;
  char *pcVar10;
  fitsdriver *__s1;
  uint uVar11;
  ulong uVar12;
  fitsfile **ppfVar13;
  int handle;
  char urltype [20];
  char compspec [80];
  char tmplfile [1025];
  char outfile [1025];
  int local_8dc;
  fitsfile **local_8d8;
  fitsfile *local_8d0;
  uint local_8c4;
  char *local_8c0;
  char local_8b8 [32];
  char local_898 [80];
  char local_848 [1040];
  char local_438 [1032];
  
  *fptr = (fitsfile *)0x0;
  iVar3 = *status;
  if (0 < iVar3) {
    return iVar3;
  }
  if (iVar3 == -0x6a) {
    *status = 0;
  }
  uVar4 = (uint)(iVar3 == -0x6a);
  if (need_to_initialize != 0) {
    iVar2 = fits_init_cfitsio();
    *status = iVar2;
  }
  if (0 < *status) {
    return *status;
  }
  for (; cVar1 = *name, cVar1 == ' '; name = name + 1) {
  }
  if (cVar1 == '\0') {
    name = "Name of file to create is blank. (ffinit)";
LAB_0012b1cb:
    ffpmsg(name);
LAB_0012b1d0:
    *status = 0x69;
    iVar3 = 0x69;
  }
  else {
    if (iVar3 != -0x6a) {
      name = name + (cVar1 == '!');
      ffourl(name,local_8b8,local_438,local_848,local_898,status);
      ppfVar13 = fptr;
      pfVar6 = (fitsfile *)(ulong)(cVar1 == '!');
      if (*status < 1) goto LAB_0012b290;
      pcVar10 = "could not parse the output filename: (ffinit)";
LAB_0012b34b:
      ffpmsg(pcVar10);
      ffpmsg(name);
LAB_0012b358:
      return *status;
    }
    sVar5 = strlen(name);
    if (0x400 < sVar5) {
      name = "Filename is too long. (ffinit)";
      goto LAB_0012b1cb;
    }
    local_8d8 = fptr;
    local_8c4 = uVar4;
    strcpy(local_438,name);
    builtin_strncpy(local_8b8,"file://",8);
    local_848[0] = '\0';
    local_8d0 = (fitsfile *)0x0;
    local_898[0] = '\0';
    ppfVar13 = local_8d8;
    pfVar6 = local_8d0;
    uVar4 = local_8c4;
LAB_0012b290:
    local_8c4 = uVar4;
    local_8d0 = pfVar6;
    local_8d8 = ppfVar13;
    uVar12 = (ulong)(uint)no_of_drivers;
    __s1 = driverTable + uVar12;
    do {
      __s1 = __s1 + -1;
      uVar4 = (uint)uVar12;
      if ((int)uVar4 < 1) {
        iVar3 = 0x7c;
        uVar11 = uVar4;
        goto LAB_0012b2e3;
      }
      iVar3 = strcmp(__s1->prefix,local_8b8);
      uVar12 = (ulong)(uVar4 - 1);
    } while (iVar3 != 0);
    iVar3 = 0;
    uVar11 = uVar4 - 1;
LAB_0012b2e3:
    *status = iVar3;
    if ((int)uVar4 < 1) {
      pcVar10 = "could not find driver for this file: (ffinit)";
      goto LAB_0012b34b;
    }
    if (((int)local_8d0 != 0) && (driverTable[(int)uVar11].remove != (_func_int_char_ptr *)0x0)) {
      (*driverTable[(int)uVar11].remove)(local_438);
    }
    if (driverTable[(int)uVar11].create == (_func_int_char_ptr_int_ptr *)0x0) {
      ffpmsg("cannot create a new file of this type: (ffinit)");
      goto LAB_0012b1cb;
    }
    iVar3 = (*driverTable[(int)uVar11].create)(local_438,&local_8dc);
    *status = iVar3;
    if (iVar3 != 0) {
      pcVar10 = "failed to create new file (already exists?):";
      goto LAB_0012b34b;
    }
    pfVar6 = (fitsfile *)calloc(1,0x10);
    *local_8d8 = pfVar6;
    if (pfVar6 == (fitsfile *)0x0) {
      (*driverTable[(int)uVar11].close)(local_8dc);
      ffpmsg("failed to allocate structure for following file: (ffopen)");
      ffpmsg(name);
    }
    else {
      local_8d0 = pfVar6;
      pFVar7 = (FITSfile *)calloc(1,0x7e8);
      local_8d0->Fptr = pFVar7;
      if (pFVar7 == (FITSfile *)0x0) {
        (*driverTable[(int)uVar11].close)(local_8dc);
        ffpmsg("failed to allocate structure for following file: (ffopen)");
        ffpmsg(name);
        ppfVar13 = local_8d8;
      }
      else {
        sVar5 = strlen(name);
        uVar4 = (int)sVar5 + 1;
        sVar5 = 0x20;
        if (0x20 < (int)uVar4) {
          sVar5 = (size_t)uVar4;
        }
        local_8c0 = (char *)malloc(sVar5);
        pFVar7->filename = local_8c0;
        if (local_8c0 == (char *)0x0) {
          (*driverTable[(int)uVar11].close)(local_8dc);
          ffpmsg("failed to allocate memory for filename: (ffinit)");
          ffpmsg(name);
          ppfVar13 = local_8d8;
          free((*local_8d8)->Fptr);
          free(*ppfVar13);
          *ppfVar13 = (fitsfile *)0x0;
          goto LAB_0012b1d0;
        }
        pLVar8 = (LONGLONG *)calloc(0x3e9,8);
        pFVar7->headstart = pLVar8;
        if (pLVar8 == (LONGLONG *)0x0) {
          (*driverTable[(int)uVar11].close)(local_8dc);
          ffpmsg("failed to allocate memory for headstart array: (ffinit)");
          ffpmsg(name);
          ppfVar13 = local_8d8;
        }
        else {
          pcVar10 = (char *)calloc(0x28,0xb40);
          pFVar7->iobuffer = pcVar10;
          if (pcVar10 != (char *)0x0) {
            memset(pFVar7->bufrecnum,0xff,0x140);
            lVar9 = 0;
            do {
              pFVar7->ageindex[lVar9] = (int)lVar9;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 0x28);
            pFVar7->MAXHDU = 1000;
            pFVar7->filehandle = local_8dc;
            pFVar7->driver = uVar11;
            strcpy(local_8c0,name);
            pFVar7->filesize = 0;
            pFVar7->logfilesize = 0;
            pFVar7->writemode = 1;
            pFVar7->datastart = -1;
            pFVar7->curbuf = -1;
            pFVar7->open_count = 1;
            pFVar7->validcode = 0x22b;
            pFVar7->noextsyntax = local_8c4;
            ffldrc(local_8d0,0,1,status);
            ppfVar13 = local_8d8;
            if (*status < 1) {
              lVar9 = 0;
              do {
                if (FptrTable[lVar9] == (FITSfile *)0x0) {
                  FptrTable[lVar9] = (*local_8d8)->Fptr;
                  break;
                }
                lVar9 = lVar9 + 1;
              } while (lVar9 != 10000);
            }
            if (local_848[0] != '\0') {
              ffoptplt(*local_8d8,local_848,status);
            }
            if (local_898[0] != '\0') {
              ffparsecompspec(*ppfVar13,local_898,status);
            }
            goto LAB_0012b358;
          }
          (*driverTable[(int)uVar11].close)(local_8dc);
          ffpmsg("failed to allocate memory for iobuffer array: (ffinit)");
          ffpmsg(name);
          ppfVar13 = local_8d8;
          free((*local_8d8)->Fptr->headstart);
        }
        free((*ppfVar13)->Fptr->filename);
        free((*ppfVar13)->Fptr);
      }
      free(*ppfVar13);
      *ppfVar13 = (fitsfile *)0x0;
    }
    *status = 0x71;
    iVar3 = 0x71;
  }
  return iVar3;
}

Assistant:

int ffinit(fitsfile **fptr,      /* O - FITS file pointer                   */
           const char *name,     /* I - name of file to create              */
           int *status)          /* IO - error status                       */
/*
  Create and initialize a new FITS file.
*/
{
    int ii, driver, slen, clobber = 0;
    char *url;
    char urltype[MAX_PREFIX_LEN], outfile[FLEN_FILENAME];
    char tmplfile[FLEN_FILENAME], compspec[80];
    int handle, create_disk_file = 0;

    *fptr = 0;              /* initialize null file pointer, */
                            /* regardless of the value of *status */
    if (*status > 0)
        return(*status);

    if (*status == CREATE_DISK_FILE)
    {
       create_disk_file = 1;
       *status = 0;
    }

    if (need_to_initialize)  {          /* this is called only once */
        *status = fits_init_cfitsio();
    }

    if (*status > 0)
        return(*status);

    url = (char *) name;
    while (*url == ' ')  /* ignore leading spaces in the filename */
        url++;

    if (*url == '\0')
    {
        ffpmsg("Name of file to create is blank. (ffinit)");
        return(*status = FILE_NOT_CREATED);
    }

    if (create_disk_file)
    {
       if (strlen(url) > FLEN_FILENAME - 1)
       {
           ffpmsg("Filename is too long. (ffinit)");
           return(*status = FILE_NOT_CREATED);
       }

       strcpy(outfile, url);
       strcpy(urltype, "file://");
       tmplfile[0] = '\0';
       compspec[0] = '\0';
    }
    else
    {
       
      /* check for clobber symbol, i.e,  overwrite existing file */
      if (*url == '!')
      {
          clobber = TRUE;
          url++;
      }
      else
          clobber = FALSE;

        /* parse the output file specification */
	/* this routine checks that the strings will not overflow */
      ffourl(url, urltype, outfile, tmplfile, compspec, status);

      if (*status > 0)
      {
        ffpmsg("could not parse the output filename: (ffinit)");
        ffpmsg(url);
        return(*status);
      }
    }
    
        /* find which driver corresponds to the urltype */
    *status = urltype2driver(urltype, &driver);

    if (*status)
    {
        ffpmsg("could not find driver for this file: (ffinit)");
        ffpmsg(url);
        return(*status);
    }

        /* delete pre-existing file, if asked to do so */
    if (clobber)
    {
        if (driverTable[driver].remove)
             (*driverTable[driver].remove)(outfile);
    }

        /* call appropriate driver to create the file */
    if (driverTable[driver].create)
    {

        FFLOCK;  /* lock this while searching for vacant handle */
        *status = (*driverTable[driver].create)(outfile, &handle);
        FFUNLOCK;

        if (*status)
        {
            ffpmsg("failed to create new file (already exists?):");
            ffpmsg(url);
            return(*status);
       }
    }
    else
    {
        ffpmsg("cannot create a new file of this type: (ffinit)");
        ffpmsg(url);
        return(*status = FILE_NOT_CREATED);
    }

        /* allocate fitsfile structure and initialize = 0 */
    *fptr = (fitsfile *) calloc(1, sizeof(fitsfile));

    if (!(*fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for following file: (ffopen)");
        ffpmsg(url);
        return(*status = MEMORY_ALLOCATION);
    }

        /* allocate FITSfile structure and initialize = 0 */
    (*fptr)->Fptr = (FITSfile *) calloc(1, sizeof(FITSfile));

    if (!((*fptr)->Fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for following file: (ffopen)");
        ffpmsg(url);
        free(*fptr);
        *fptr = 0;       
        return(*status = MEMORY_ALLOCATION);
    }

    slen = strlen(url) + 1;
    slen = maxvalue(slen, 32); /* reserve at least 32 chars */ 
    ((*fptr)->Fptr)->filename = (char *) malloc(slen); /* mem for file name */

    if ( !(((*fptr)->Fptr)->filename) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for filename: (ffinit)");
        ffpmsg(url);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = FILE_NOT_CREATED);
    }

    /* mem for headstart array */
    ((*fptr)->Fptr)->headstart = (LONGLONG *) calloc(1001, sizeof(LONGLONG)); 

    if ( !(((*fptr)->Fptr)->headstart) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for headstart array: (ffinit)");
        ffpmsg(url);
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* mem for file I/O buffers */
    ((*fptr)->Fptr)->iobuffer = (char *) calloc(NIOBUF, IOBUFLEN);

    if ( !(((*fptr)->Fptr)->iobuffer) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for iobuffer array: (ffinit)");
        ffpmsg(url);
        free( ((*fptr)->Fptr)->headstart);    /* free memory for headstart array */
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* initialize the ageindex array (relative age of the I/O buffers) */
    /* and initialize the bufrecnum array as being empty */
    for (ii = 0; ii < NIOBUF; ii++)  {
        ((*fptr)->Fptr)->ageindex[ii] = ii;
        ((*fptr)->Fptr)->bufrecnum[ii] = -1;
    }

        /* store the parameters describing the file */
    ((*fptr)->Fptr)->MAXHDU = 1000;              /* initial size of headstart */
    ((*fptr)->Fptr)->filehandle = handle;        /* store the file pointer */
    ((*fptr)->Fptr)->driver = driver;            /*  driver number         */
    strcpy(((*fptr)->Fptr)->filename, url);      /* full input filename    */
    ((*fptr)->Fptr)->filesize = 0;               /* physical file size     */
    ((*fptr)->Fptr)->logfilesize = 0;            /* logical file size      */
    ((*fptr)->Fptr)->writemode = 1;              /* read-write mode        */
    ((*fptr)->Fptr)->datastart = DATA_UNDEFINED; /* unknown start of data  */
    ((*fptr)->Fptr)->curbuf = -1;         /* undefined current IO buffer   */
    ((*fptr)->Fptr)->open_count = 1;      /* structure is currently used once */
    ((*fptr)->Fptr)->validcode = VALIDSTRUC; /* flag denoting valid structure */
    ((*fptr)->Fptr)->noextsyntax = create_disk_file; /* true if extended syntax is disabled */

    ffldrc(*fptr, 0, IGNORE_EOF, status);     /* initialize first record */

    fits_store_Fptr( (*fptr)->Fptr, status);  /* store Fptr address */

    /* if template file was given, use it to define structure of new file */

    if (tmplfile[0])
        ffoptplt(*fptr, tmplfile, status);

    /* parse and save image compression specification, if given */
    if (compspec[0])
        ffparsecompspec(*fptr, compspec, status);

    return(*status);                       /* successful return */
}